

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

roaring_bitmap_t * roaring_bitmap_and(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  ushort key;
  ushort uVar1;
  uint32_t uVar2;
  uint16_t *puVar3;
  uint16_t *puVar4;
  long lVar5;
  int *c;
  int iVar6;
  uint uVar7;
  int *piVar8;
  uint uVar9;
  ulong uVar10;
  uint8_t uVar11;
  uint32_t cap;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  bool bVar18;
  uint8_t result_type;
  uint8_t local_3d;
  uint32_t local_3c;
  roaring_array_t *local_38;
  
  local_3d = '\0';
  uVar2 = (x1->high_low_container).size;
  local_3c = (x2->high_low_container).size;
  cap = local_3c;
  if ((int)uVar2 < (int)local_3c) {
    cap = uVar2;
  }
  local_38 = &roaring_bitmap_create_with_capacity(cap)->high_low_container;
  if ((((x1->high_low_container).flags & 1) == 0) && (((x2->high_low_container).flags & 1) == 0)) {
    local_38->flags = local_38->flags & 0xfe;
  }
  else {
    local_38->flags = local_38->flags | 1;
  }
  if (0 < (int)local_3c && 0 < (int)uVar2) {
    uVar17 = 0;
    uVar16 = 0;
    do {
      puVar3 = (x1->high_low_container).keys;
      uVar12 = uVar17 & 0xffff;
      key = puVar3[uVar12];
      puVar4 = (x2->high_low_container).keys;
      uVar14 = uVar16 & 0xffff;
      uVar1 = puVar4[uVar14];
      if (key == uVar1) {
        c = (int *)container_and((x1->high_low_container).containers[uVar12],
                                 (x1->high_low_container).typecodes[uVar12],
                                 (x2->high_low_container).containers[uVar14],
                                 (x2->high_low_container).typecodes[uVar14],&local_3d);
        piVar8 = c;
        uVar11 = local_3d;
        if (local_3d == '\x04') {
          uVar11 = (uint8_t)c[2];
          piVar8 = *(int **)c;
        }
        iVar15 = *piVar8;
        if ((uVar11 == '\x03') || (uVar11 == '\x02')) {
          bVar18 = 0 < iVar15;
        }
        else {
          if (iVar15 == -1) {
            if (**(long **)(piVar8 + 2) == 0) {
              uVar10 = 0xffffffffffffffff;
              do {
                if (uVar10 == 0x3fe) {
                  uVar13 = 0x3ff;
                  break;
                }
                uVar13 = uVar10 + 1;
                lVar5 = uVar10 + 2;
                uVar10 = uVar13;
              } while ((*(long **)(piVar8 + 2))[lVar5] == 0);
              bVar18 = 0x3fe < uVar13;
            }
            else {
              bVar18 = false;
            }
          }
          else {
            bVar18 = iVar15 == 0;
          }
          bVar18 = (bool)(bVar18 ^ 1);
        }
        if (bVar18) {
          ra_append(local_38,key,c,local_3d);
        }
        else {
          container_free(c,local_3d);
        }
        uVar9 = uVar17 + 1;
        uVar7 = uVar16 + 1;
      }
      else if (key < uVar1) {
        uVar14 = (x1->high_low_container).size;
        uVar12 = uVar17 + 1;
        uVar9 = uVar12;
        uVar7 = uVar16;
        if (((int)uVar12 < (int)uVar14) && (puVar3[(int)uVar12] < uVar1)) {
          uVar17 = uVar17 + 2;
          iVar15 = 1;
          if ((int)uVar17 < (int)uVar14) {
            iVar6 = 1;
            do {
              iVar15 = iVar6;
              if (uVar1 <= puVar3[(int)uVar17]) goto LAB_001049d6;
              iVar15 = iVar6 * 2;
              uVar17 = uVar12 + iVar6 * 2;
              iVar6 = iVar15;
            } while ((int)uVar17 < (int)uVar14);
          }
          uVar17 = uVar14 - 1;
LAB_001049d6:
          uVar9 = uVar17;
          if (((puVar3[(int)uVar17] != uVar1) && (uVar9 = uVar14, uVar1 <= puVar3[(int)uVar17])) &&
             (uVar9 = uVar17, (iVar15 >> 1) + uVar12 + 1 != uVar17)) {
            uVar12 = (iVar15 >> 1) + uVar12;
            do {
              uVar9 = (int)(uVar12 + uVar17) >> 1;
              if (puVar3[(int)uVar9] == uVar1) break;
              if (uVar1 <= puVar3[(int)uVar9]) {
                uVar17 = uVar9;
                uVar9 = uVar12;
              }
              uVar12 = uVar9;
              uVar9 = uVar17;
            } while (uVar12 + 1 != uVar17);
          }
        }
      }
      else {
        uVar14 = (x2->high_low_container).size;
        uVar12 = uVar16 + 1;
        uVar9 = uVar17;
        uVar7 = uVar12;
        if (((int)uVar12 < (int)uVar14) && (puVar4[(int)uVar12] < key)) {
          uVar16 = uVar16 + 2;
          iVar15 = 1;
          if ((int)uVar16 < (int)uVar14) {
            iVar6 = 1;
            do {
              iVar15 = iVar6;
              if (key <= puVar4[(int)uVar16]) goto LAB_00104a39;
              iVar15 = iVar6 * 2;
              uVar16 = uVar12 + iVar6 * 2;
              iVar6 = iVar15;
            } while ((int)uVar16 < (int)uVar14);
          }
          uVar16 = uVar14 - 1;
LAB_00104a39:
          uVar7 = uVar16;
          if (((puVar4[(int)uVar16] != key) && (uVar7 = uVar14, key <= puVar4[(int)uVar16])) &&
             (uVar7 = uVar16, (iVar15 >> 1) + uVar12 + 1 != uVar16)) {
            uVar12 = (iVar15 >> 1) + uVar12;
            do {
              uVar7 = (int)(uVar12 + uVar16) >> 1;
              if (puVar4[(int)uVar7] == key) break;
              if (key <= puVar4[(int)uVar7]) {
                uVar16 = uVar7;
                uVar7 = uVar12;
              }
              uVar12 = uVar7;
              uVar7 = uVar16;
            } while (uVar12 + 1 != uVar16);
          }
        }
      }
      uVar16 = uVar7;
      uVar17 = uVar9;
    } while (((int)uVar17 < (int)uVar2) && ((int)uVar16 < (int)local_3c));
  }
  return (roaring_bitmap_t *)local_38;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_and(const roaring_bitmap_t *x1,
                                     const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    uint32_t neededcap = length1 > length2 ? length2 : length1;
    roaring_bitmap_t *answer = roaring_bitmap_create_with_capacity(neededcap);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) || is_cow(x2));

    int pos1 = 0, pos2 = 0;

    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 =
            ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
        const uint16_t s2 =
            ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        if (s1 == s2) {
            uint8_t type1, type2;
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            container_t *c = container_and(c1, type1, c2, type2, &result_type);

            if (container_nonzero_cardinality(c, result_type)) {
                ra_append(&answer->high_low_container, s1, c, result_type);
            } else {
                container_free(c, result_type);  // otherwise: memory leak!
            }
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {  // s1 < s2
            pos1 = ra_advance_until(&x1->high_low_container, s2, pos1);
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
        }
    }
    return answer;
}